

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int lws_h2_client_handshake(lws *wsi)

{
  uchar *buf;
  char cVar1;
  int iVar2;
  uchar *puVar3;
  lws *plVar4;
  size_t sVar5;
  uchar *puVar6;
  lws_write_protocol wp;
  uint uVar7;
  uchar *puVar8;
  uint8_t *p;
  uchar *local_50;
  uint local_44;
  uchar *local_40;
  lws_context *local_38;
  
  local_38 = wsi->context;
  cVar1 = wsi->tsi;
  puVar3 = (uchar *)lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_METHOD);
  local_40 = (uchar *)lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_URI);
  plVar4 = lws_get_network_wsi(wsi);
  uVar7 = ((plVar4->h2).h2n)->highest_sid_opened + 2;
  _lws_log(0x10,"%s\n","lws_h2_client_handshake");
  ((plVar4->h2).h2n)->highest_sid_opened = uVar7;
  (wsi->mux).my_sid = uVar7;
  local_44 = uVar7;
  _lws_log(8,"%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n","lws_h2_client_handshake",
           (ulong)uVar7);
  puVar8 = local_38->pt[cVar1].serv_buf;
  buf = puVar8 + 0x10;
  puVar8 = puVar8 + ((ulong)(wsi->context->pt_serv_buf_size >> 1) - 1);
  puVar6 = (uchar *)"GET";
  if (puVar3 != (uchar *)0x0) {
    puVar6 = puVar3;
  }
  local_50 = buf;
  sVar5 = strlen((char *)puVar6);
  iVar2 = lws_add_http_header_by_token
                    (wsi,WSI_TOKEN_HTTP_COLON_METHOD,puVar6,(int)sVar5,&local_50,puVar8);
  if ((iVar2 == 0) &&
     (iVar2 = lws_add_http_header_by_token
                        (wsi,WSI_TOKEN_HTTP_COLON_SCHEME,(uchar *)"https",5,&local_50,puVar8),
     iVar2 == 0)) {
    iVar2 = lws_hdr_total_length(wsi,_WSI_TOKEN_CLIENT_URI);
    iVar2 = lws_add_http_header_by_token
                      (wsi,WSI_TOKEN_HTTP_COLON_PATH,local_40,iVar2,&local_50,puVar8);
    if (iVar2 == 0) {
      puVar6 = (uchar *)lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_ORIGIN);
      iVar2 = lws_hdr_total_length(wsi,_WSI_TOKEN_CLIENT_ORIGIN);
      iVar2 = lws_add_http_header_by_token
                        (wsi,WSI_TOKEN_HTTP_COLON_AUTHORITY,puVar6,iVar2,&local_50,puVar8);
      if (iVar2 == 0) {
        puVar6 = (uchar *)lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_HOST);
        iVar2 = lws_hdr_total_length(wsi,_WSI_TOKEN_CLIENT_HOST);
        iVar2 = lws_add_http_header_by_token(wsi,WSI_TOKEN_HOST,puVar6,iVar2,&local_50,puVar8);
        if (((iVar2 == 0) &&
            (iVar2 = lws_add_http_header_by_token
                               (wsi,WSI_TOKEN_HTTP_USER_AGENT,(uchar *)"lwsss",5,&local_50,puVar8),
            iVar2 == 0)) &&
           ((puVar6 = local_50, (wsi->flags & 0x400) == 0 ||
            (puVar6 = lws_http_multipart_headers(wsi,local_50), puVar6 != (uint8_t *)0x0)))) {
          local_50 = puVar6;
          if ((wsi->flags & 0x800) != 0) {
            iVar2 = lws_add_http_header_by_token
                              (wsi,WSI_TOKEN_HTTP_CONTENT_TYPE,
                               (uchar *)"application/x-www-form-urlencoded",0x21,&local_50,puVar8);
            if (iVar2 != 0) goto LAB_0012f0b8;
            lws_client_http_body_pending(wsi,1);
          }
          iVar2 = (*wsi->protocol->callback)
                            (wsi,LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,wsi->user_space,
                             &local_50,(size_t)(puVar8 + (-0xc - (long)local_50)));
          if ((iVar2 == 0) && (iVar2 = lws_finalize_http_header(wsi,&local_50,puVar8), iVar2 == 0))
          {
            wp = LWS_WRITE_HTTP_HEADERS;
            if ((wsi->flags & 0x20) != 0) {
              wp = (uint)((wsi->field_0x2e2 & 1) == 0) << 7 | LWS_WRITE_HTTP_HEADERS;
            }
            uVar7 = lws_write(wsi,buf,(long)local_50 - (long)buf,wp);
            if ((long)local_50 - (long)buf != (long)(int)uVar7) {
              _lws_log(1,"_write returned %d from %ld\n",(ulong)uVar7);
              return -1;
            }
            iVar2 = 0x40000;
            if ((wsi->flags & 0x200) != 0) {
              iVar2 = (wsi->txc).manual_initial_tx_credit;
              (wsi->txc).manual = '\x01';
            }
            iVar2 = lws_h2_update_peer_txcredit(wsi,local_44,iVar2);
            if (iVar2 == 0) {
              lws_h2_state(wsi,LWS_H2_STATE_OPEN);
              lwsi_set_state(wsi,0x119);
              if ((wsi->flags & 0x400) != 0) {
                lws_callback_on_writable(wsi);
                return 0;
              }
              return 0;
            }
            return 1;
          }
        }
      }
    }
  }
LAB_0012f0b8:
  _lws_log(1,"Client hdrs too long: incr context info.pt_serv_buf_size\n");
  return -1;
}

Assistant:

int
lws_h2_client_handshake(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *buf, *start, *p, *p1, *end;
	char *meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD),
	     *uri = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI);
	struct lws *nwsi = lws_get_network_wsi(wsi);
	int n, m;
	/*
	 * The identifier of a newly established stream MUST be numerically
	 * greater than all streams that the initiating endpoint has opened or
	 * reserved.  This governs streams that are opened using a HEADERS frame
	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
	 * receives an unexpected stream identifier MUST respond with a
	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	int sid = nwsi->h2.h2n->highest_sid_opened + 2;

	lwsl_debug("%s\n", __func__);

	nwsi->h2.h2n->highest_sid_opened = sid;
	wsi->mux.my_sid = sid;

	lwsl_info("%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n",
			__func__, wsi->mux.my_sid);

	p = start = buf = pt->serv_buf + LWS_PRE;
	end = start + (wsi->context->pt_serv_buf_size / 2) - LWS_PRE - 1;

	/* it's time for us to send our client stream headers */

	if (!meth)
		meth = "GET";

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_METHOD,
				(unsigned char *)meth,
				(int)strlen(meth), &p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_SCHEME,
				(unsigned char *)"https", 5,
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_PATH,
				(unsigned char *)uri,
				lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_AUTHORITY,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_ORIGIN),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_ORIGIN),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HOST,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_HOST),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_HOST),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_USER_AGENT,
				(unsigned char *)"lwsss", 5,
				&p, end))
		goto fail_length;

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = lws_http_multipart_headers(wsi, p);
		if (!p1)
			goto fail_length;
		p = p1;
	}

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
			   (unsigned char *)"application/x-www-form-urlencoded",
			   33, &p, end))
			goto fail_length;
		lws_client_http_body_pending(wsi, 1);
	}

	/* give userland a chance to append, eg, cookies */

	if (wsi->protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
				wsi->user_space, &p, (end - p) - 12))
		goto fail_length;

	if (lws_finalize_http_header(wsi, &p, end))
		goto fail_length;

#if defined(LWS_WITH_DETAILED_LATENCY)
	wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif

	m = LWS_WRITE_HTTP_HEADERS;
#if defined(LWS_WITH_CLIENT)
	/* below is not needed in spec, indeed it destroys the long poll
	 * feature, but required by nghttp2 */
	if ((wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) &&
	    !(wsi->client_http_body_pending))
		m |= LWS_WRITE_H2_STREAM_END;
#endif

	// lwsl_hexdump_notice(start, p - start);

	n = lws_write(wsi, start, p - start, m);

	if (n != (p - start)) {
		lwsl_err("_write returned %d from %ld\n", n,
			 (long)(p - start));
		return -1;
	}

	/*
	 * Normally let's charge up the peer tx credit a bit.  But if
	 * MANUAL_REFLOW is set, just set it to the initial credit given in
	 * the client create info
	 */

	n = 4 * 65536;
	if (wsi->flags & LCCSCF_H2_MANUAL_RXFLOW) {
		n = wsi->txc.manual_initial_tx_credit;
		wsi->txc.manual = 1;
	}

	if (lws_h2_update_peer_txcredit(wsi, sid, n))
		return 1;

	lws_h2_state(wsi, LWS_H2_STATE_OPEN);
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME)
		lws_callback_on_writable(wsi);

	return 0;

fail_length:
	lwsl_err("Client hdrs too long: incr context info.pt_serv_buf_size\n");

	return -1;
}